

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O0

REF_STATUS
ref_shard_add_pyr_as_tet(REF_NODE ref_node,REF_CELL ref_cell,REF_INT *nodes,REF_BOOL check_volume)

{
  uint uVar1;
  REF_GLOB local_1c8;
  double dStack_1b8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_DBL vol_3;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_DBL vol_2;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_DBL vol_1;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_DBL vol;
  uint local_178;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT tet_nodes [27];
  REF_GLOB global [27];
  REF_INT node;
  REF_BOOL check_volume_local;
  REF_INT *nodes_local;
  REF_CELL ref_cell_local;
  REF_NODE ref_node_local;
  
  for (global[0x1a]._0_4_ = 0; (int)global[0x1a] < 5; global[0x1a]._0_4_ = (int)global[0x1a] + 1) {
    if (((nodes[(int)global[0x1a]] < 0) || (ref_node->max <= nodes[(int)global[0x1a]])) ||
       (ref_node->global[nodes[(int)global[0x1a]]] < 0)) {
      local_1c8 = -1;
    }
    else {
      local_1c8 = ref_node->global[nodes[(int)global[0x1a]]];
    }
    *(REF_GLOB *)(tet_nodes + (long)(int)global[0x1a] * 2 + 0x1a) = local_1c8;
  }
  if (((stack0xfffffffffffffef8 < global[0]) && (stack0xfffffffffffffef8 < global[2])) ||
     ((global[3] < global[0] && (global[3] < global[2])))) {
    local_178 = *nodes;
    ref_private_macro_code_rss = nodes[4];
    tet_nodes[0] = nodes[1];
    tet_nodes[1] = nodes[2];
    vol._4_4_ = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_178);
    if (vol._4_4_ != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x26e
             ,"ref_shard_add_pyr_as_tet",(ulong)vol._4_4_,"a tet");
      return vol._4_4_;
    }
    if (check_volume != 0) {
      vol_1._4_4_ = ref_node_tet_vol(ref_node,(REF_INT *)&local_178,
                                     (REF_DBL *)&ref_private_macro_code_rss_2);
      if (vol_1._4_4_ != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x26f,"ref_shard_add_pyr_as_tet",(ulong)vol_1._4_4_,"tet vol");
        return vol_1._4_4_;
      }
      if (_ref_private_macro_code_rss_2 <= 0.0) {
        printf("tet vol %e\n",_ref_private_macro_code_rss_2);
        printf("nodes %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
               (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4]);
        printf("tet %d %d %d %d\n",(ulong)local_178,(ulong)(uint)ref_private_macro_code_rss,
               (ulong)(uint)tet_nodes[0],(ulong)(uint)tet_nodes[1]);
      }
    }
    local_178 = *nodes;
    ref_private_macro_code_rss = nodes[3];
    tet_nodes[0] = nodes[4];
    tet_nodes[1] = nodes[2];
    vol_1._0_4_ = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_178);
    if (vol_1._0_4_ != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x274
             ,"ref_shard_add_pyr_as_tet",(ulong)vol_1._0_4_,"a tet");
      return vol_1._0_4_;
    }
    if (check_volume != 0) {
      vol_2._4_4_ = ref_node_tet_vol(ref_node,(REF_INT *)&local_178,
                                     (REF_DBL *)&ref_private_macro_code_rss_4);
      if (vol_2._4_4_ != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x275,"ref_shard_add_pyr_as_tet",(ulong)vol_2._4_4_,"tet vol");
        return vol_2._4_4_;
      }
      if (_ref_private_macro_code_rss_4 <= 0.0) {
        printf("tet vol %e\n",_ref_private_macro_code_rss_4);
        printf("nodes %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
               (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4]);
        printf("tet %d %d %d %d\n",(ulong)local_178,(ulong)(uint)ref_private_macro_code_rss,
               (ulong)(uint)tet_nodes[0],(ulong)(uint)tet_nodes[1]);
      }
    }
  }
  else {
    local_178 = *nodes;
    ref_private_macro_code_rss = nodes[3];
    tet_nodes[0] = nodes[1];
    tet_nodes[1] = nodes[2];
    vol_2._0_4_ = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_178);
    if (vol_2._0_4_ != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x27e
             ,"ref_shard_add_pyr_as_tet",(ulong)vol_2._0_4_,"a tet");
      return vol_2._0_4_;
    }
    if (check_volume != 0) {
      vol_3._4_4_ = ref_node_tet_vol(ref_node,(REF_INT *)&local_178,
                                     (REF_DBL *)&ref_private_macro_code_rss_6);
      if (vol_3._4_4_ != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x27f,"ref_shard_add_pyr_as_tet",(ulong)vol_3._4_4_,"tet vol");
        return vol_3._4_4_;
      }
      if (_ref_private_macro_code_rss_6 <= 0.0) {
        printf("tet vol %e\n",_ref_private_macro_code_rss_6);
        printf("nodes %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
               (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4]);
        printf("tet %d %d %d %d\n",(ulong)local_178,(ulong)(uint)ref_private_macro_code_rss,
               (ulong)(uint)tet_nodes[0],(ulong)(uint)tet_nodes[1]);
      }
    }
    local_178 = nodes[1];
    ref_private_macro_code_rss = nodes[3];
    tet_nodes[0] = nodes[4];
    tet_nodes[1] = nodes[2];
    vol_3._0_4_ = ref_shard_cell_add_local(ref_node,ref_cell,(REF_INT *)&local_178);
    if (vol_3._0_4_ != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0x284
             ,"ref_shard_add_pyr_as_tet",(ulong)vol_3._0_4_,"a tet");
      return vol_3._0_4_;
    }
    if (check_volume != 0) {
      uVar1 = ref_node_tet_vol(ref_node,(REF_INT *)&local_178,&stack0xfffffffffffffe48);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x285,"ref_shard_add_pyr_as_tet",(ulong)uVar1,"tet vol");
        return uVar1;
      }
      if (dStack_1b8 <= 0.0) {
        printf("tet vol %e\n",dStack_1b8);
        printf("nodes %d %d %d %d %d\n",(ulong)(uint)*nodes,(ulong)(uint)nodes[1],
               (ulong)(uint)nodes[2],(ulong)(uint)nodes[3],(ulong)(uint)nodes[4]);
        printf("tet %d %d %d %d\n",(ulong)local_178,(ulong)(uint)ref_private_macro_code_rss,
               (ulong)(uint)tet_nodes[0],(ulong)(uint)tet_nodes[1]);
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_shard_add_pyr_as_tet(REF_NODE ref_node,
                                                   REF_CELL ref_cell,
                                                   REF_INT *nodes,
                                                   REF_BOOL check_volume) {
  REF_INT node;
  REF_GLOB global[REF_CELL_MAX_SIZE_PER];
  REF_INT tet_nodes[REF_CELL_MAX_SIZE_PER];
  for (node = 0; node < 5; node++)
    global[node] = ref_node_global(ref_node, nodes[node]);

  if ((global[0] < global[1] && global[0] < global[3]) ||
      (global[4] < global[1] &&
       global[4] < global[3])) { /* 0-4 diag split of quad */
                                 /* 4-1\
                                    |\| 2
                                    3-0/ */
    tet_nodes[0] = nodes[0];
    tet_nodes[1] = nodes[4];
    tet_nodes[2] = nodes[1];
    tet_nodes[3] = nodes[2];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_pyr_tet_volume();
    tet_nodes[0] = nodes[0];
    tet_nodes[1] = nodes[3];
    tet_nodes[2] = nodes[4];
    tet_nodes[3] = nodes[2];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_pyr_tet_volume();
  } else { /* 3-1 diag split of quad */
           /* 4-1\
              |/| 2
              3-0/ */
    tet_nodes[0] = nodes[0];
    tet_nodes[1] = nodes[3];
    tet_nodes[2] = nodes[1];
    tet_nodes[3] = nodes[2];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_pyr_tet_volume();
    tet_nodes[0] = nodes[1];
    tet_nodes[1] = nodes[3];
    tet_nodes[2] = nodes[4];
    tet_nodes[3] = nodes[2];
    RSS(ref_shard_cell_add_local(ref_node, ref_cell, tet_nodes), "a tet");
    if (check_volume) check_pyr_tet_volume();
  }
  return REF_SUCCESS;
}